

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void bench_ecdh_setup(void *arg)

{
  char *pcVar1;
  char cVar2;
  char cVar10;
  char cVar18;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 auVar38 [16];
  int iVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  undefined8 *puVar44;
  undefined8 *puVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar56;
  short sVar57;
  undefined1 auVar65 [16];
  short sVar66;
  short sVar67;
  undefined1 auVar72 [12];
  undefined1 auVar77 [16];
  undefined4 uVar79;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uchar point [33];
  undefined1 auStack_110 [64];
  undefined8 *puStack_d0;
  ulong uStack_c8;
  undefined1 *puStack_c0;
  code *pcStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined1 auStack_90 [64];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 local_8;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 *puVar43;
  long lVar48;
  undefined4 uVar58;
  undefined6 uVar59;
  undefined8 uVar60;
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [14];
  undefined1 auVar64 [14];
  undefined4 uVar68;
  undefined6 uVar69;
  undefined8 uVar70;
  undefined1 auVar71 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [14];
  undefined1 auVar75 [14];
  undefined1 auVar76 [14];
  undefined1 auVar78 [16];
  undefined6 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar83 [14];
  undefined1 auVar86 [16];
  
  auVar38 = _DAT_00105090;
  local_18 = 0x908c4e0ee37c75fd;
  uStack_10 = 0xc683f884d1baa2fb;
  local_28 = 0x9709325dc1945403;
  uStack_20 = 0x458734945f39c206;
  local_8 = 0x9f;
  lVar40 = 0x48;
  auVar47 = _DAT_00105010;
  auVar49 = _DAT_00105020;
  auVar50 = _DAT_00105030;
  auVar51 = _DAT_00105040;
  auVar52 = _DAT_00105050;
  auVar53 = _DAT_00105060;
  auVar54 = _DAT_00105070;
  auVar55 = _DAT_00105080;
  do {
    auVar65 = auVar55 & auVar38;
    auVar77 = auVar54 & auVar38;
    sVar26 = auVar65._0_2_;
    cVar2 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0] - (0xff < sVar26);
    sVar26 = auVar65._2_2_;
    sVar56 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * auVar65[2] - (0xff < sVar26),cVar2);
    sVar26 = auVar65._4_2_;
    cVar3 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[4] - (0xff < sVar26);
    sVar26 = auVar65._6_2_;
    uVar58 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * auVar65[6] - (0xff < sVar26),
                      CONCAT12(cVar3,sVar56));
    sVar26 = auVar65._8_2_;
    cVar4 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[8] - (0xff < sVar26);
    sVar26 = auVar65._10_2_;
    uVar59 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar65[10] - (0xff < sVar26),
                      CONCAT14(cVar4,uVar58));
    sVar26 = auVar65._12_2_;
    cVar5 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0xc] - (0xff < sVar26);
    sVar26 = auVar65._14_2_;
    uVar60 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * auVar65[0xe] - (0xff < sVar26),
                      CONCAT16(cVar5,uVar59));
    sVar26 = auVar77._0_2_;
    cVar6 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[0] - (0xff < sVar26);
    sVar26 = auVar77._2_2_;
    auVar61._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * auVar77[2] - (0xff < sVar26),
                  CONCAT18(cVar6,uVar60));
    sVar26 = auVar77._4_2_;
    cVar7 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[4] - (0xff < sVar26);
    auVar61[10] = cVar7;
    sVar26 = auVar77._6_2_;
    auVar61[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar77[6] - (0xff < sVar26);
    sVar26 = auVar77._8_2_;
    cVar8 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[8] - (0xff < sVar26);
    auVar63[0xc] = cVar8;
    auVar63._0_12_ = auVar61;
    sVar26 = auVar77._10_2_;
    auVar63[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar77[10] - (0xff < sVar26);
    sVar26 = auVar77._12_2_;
    cVar9 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[0xc] - (0xff < sVar26);
    auVar65[0xe] = cVar9;
    auVar65._0_14_ = auVar63;
    sVar26 = auVar77._14_2_;
    auVar65[0xf] = (0 < sVar26) * (sVar26 < 0x100) * auVar77[0xe] - (0xff < sVar26);
    auVar77 = auVar53 & auVar38;
    auVar84 = auVar52 & auVar38;
    sVar26 = auVar77._0_2_;
    cVar10 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[0] - (0xff < sVar26);
    sVar26 = auVar77._2_2_;
    sVar66 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * auVar77[2] - (0xff < sVar26),cVar10);
    sVar26 = auVar77._4_2_;
    cVar11 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[4] - (0xff < sVar26);
    sVar26 = auVar77._6_2_;
    uVar68 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * auVar77[6] - (0xff < sVar26),
                      CONCAT12(cVar11,sVar66));
    sVar26 = auVar77._8_2_;
    cVar12 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[8] - (0xff < sVar26);
    sVar26 = auVar77._10_2_;
    uVar69 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar77[10] - (0xff < sVar26),
                      CONCAT14(cVar12,uVar68));
    sVar26 = auVar77._12_2_;
    cVar13 = (0 < sVar26) * (sVar26 < 0x100) * auVar77[0xc] - (0xff < sVar26);
    sVar26 = auVar77._14_2_;
    uVar70 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * auVar77[0xe] - (0xff < sVar26),
                      CONCAT16(cVar13,uVar69));
    sVar26 = auVar84._0_2_;
    cVar14 = (0 < sVar26) * (sVar26 < 0x100) * auVar84[0] - (0xff < sVar26);
    sVar26 = auVar84._2_2_;
    auVar71._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * auVar84[2] - (0xff < sVar26),
                  CONCAT18(cVar14,uVar70));
    sVar26 = auVar84._4_2_;
    cVar15 = (0 < sVar26) * (sVar26 < 0x100) * auVar84[4] - (0xff < sVar26);
    auVar71[10] = cVar15;
    sVar26 = auVar84._6_2_;
    auVar71[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar84[6] - (0xff < sVar26);
    sVar26 = auVar84._8_2_;
    cVar16 = (0 < sVar26) * (sVar26 < 0x100) * auVar84[8] - (0xff < sVar26);
    auVar74[0xc] = cVar16;
    auVar74._0_12_ = auVar71;
    sVar26 = auVar84._10_2_;
    auVar74[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar84[10] - (0xff < sVar26);
    sVar26 = auVar84._12_2_;
    cVar17 = (0 < sVar26) * (sVar26 < 0x100) * auVar84[0xc] - (0xff < sVar26);
    auVar85[0xe] = cVar17;
    auVar85._0_14_ = auVar74;
    sVar26 = auVar84._14_2_;
    auVar85[0xf] = (0 < sVar26) * (sVar26 < 0x100) * auVar84[0xe] - (0xff < sVar26);
    cVar2 = (0 < sVar56) * (sVar56 < 0x100) * cVar2 - (0xff < sVar56);
    sVar26 = (short)((uint)uVar58 >> 0x10);
    sVar57 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * cVar3 - (0xff < sVar26),cVar2);
    sVar26 = (short)((uint6)uVar59 >> 0x20);
    cVar3 = (0 < sVar26) * (sVar26 < 0x100) * cVar4 - (0xff < sVar26);
    sVar26 = (short)((ulong)uVar60 >> 0x30);
    uVar58 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * cVar5 - (0xff < sVar26),
                      CONCAT12(cVar3,sVar57));
    sVar26 = (short)((unkuint10)auVar61._0_10_ >> 0x40);
    cVar4 = (0 < sVar26) * (sVar26 < 0x100) * cVar6 - (0xff < sVar26);
    sVar26 = auVar61._10_2_;
    uVar59 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * cVar7 - (0xff < sVar26),
                      CONCAT14(cVar4,uVar58));
    sVar26 = auVar63._12_2_;
    cVar5 = (0 < sVar26) * (sVar26 < 0x100) * cVar8 - (0xff < sVar26);
    sVar26 = auVar65._14_2_;
    uVar60 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * cVar9 - (0xff < sVar26),
                      CONCAT16(cVar5,uVar59));
    cVar6 = (0 < sVar66) * (sVar66 < 0x100) * cVar10 - (0xff < sVar66);
    sVar26 = (short)((uint)uVar68 >> 0x10);
    auVar62._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26),CONCAT18(cVar6,uVar60))
    ;
    sVar26 = (short)((uint6)uVar69 >> 0x20);
    cVar7 = (0 < sVar26) * (sVar26 < 0x100) * cVar12 - (0xff < sVar26);
    auVar62[10] = cVar7;
    sVar26 = (short)((ulong)uVar70 >> 0x30);
    auVar62[0xb] = (0 < sVar26) * (sVar26 < 0x100) * cVar13 - (0xff < sVar26);
    sVar26 = (short)((unkuint10)auVar71._0_10_ >> 0x40);
    cVar8 = (0 < sVar26) * (sVar26 < 0x100) * cVar14 - (0xff < sVar26);
    auVar64[0xc] = cVar8;
    auVar64._0_12_ = auVar62;
    sVar26 = auVar71._10_2_;
    auVar64[0xd] = (0 < sVar26) * (sVar26 < 0x100) * cVar15 - (0xff < sVar26);
    sVar26 = auVar74._12_2_;
    cVar9 = (0 < sVar26) * (sVar26 < 0x100) * cVar16 - (0xff < sVar26);
    auVar77[0xe] = cVar9;
    auVar77._0_14_ = auVar64;
    sVar26 = auVar85._14_2_;
    auVar77[0xf] = (0 < sVar26) * (sVar26 < 0x100) * cVar17 - (0xff < sVar26);
    auVar65 = auVar51 & auVar38;
    auVar85 = auVar50 & auVar38;
    sVar26 = auVar65._0_2_;
    cVar16 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0] - (0xff < sVar26);
    sVar26 = auVar65._2_2_;
    sVar56 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * auVar65[2] - (0xff < sVar26),cVar16);
    sVar26 = auVar65._4_2_;
    cVar11 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[4] - (0xff < sVar26);
    sVar26 = auVar65._6_2_;
    uVar68 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * auVar65[6] - (0xff < sVar26),
                      CONCAT12(cVar11,sVar56));
    sVar26 = auVar65._8_2_;
    cVar12 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[8] - (0xff < sVar26);
    sVar26 = auVar65._10_2_;
    uVar69 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar65[10] - (0xff < sVar26),
                      CONCAT14(cVar12,uVar68));
    sVar26 = auVar65._12_2_;
    cVar13 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0xc] - (0xff < sVar26);
    sVar26 = auVar65._14_2_;
    uVar70 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * auVar65[0xe] - (0xff < sVar26),
                      CONCAT16(cVar13,uVar69));
    sVar26 = auVar85._0_2_;
    cVar10 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0] - (0xff < sVar26);
    sVar26 = auVar85._2_2_;
    auVar72._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * auVar85[2] - (0xff < sVar26),
                  CONCAT18(cVar10,uVar70));
    sVar26 = auVar85._4_2_;
    cVar14 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[4] - (0xff < sVar26);
    auVar72[10] = cVar14;
    sVar26 = auVar85._6_2_;
    auVar72[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[6] - (0xff < sVar26);
    sVar26 = auVar85._8_2_;
    cVar15 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[8] - (0xff < sVar26);
    auVar75[0xc] = cVar15;
    auVar75._0_12_ = auVar72;
    sVar26 = auVar85._10_2_;
    auVar75[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[10] - (0xff < sVar26);
    sVar26 = auVar85._12_2_;
    cVar17 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0xc] - (0xff < sVar26);
    auVar84[0xe] = cVar17;
    auVar84._0_14_ = auVar75;
    sVar26 = auVar85._14_2_;
    auVar84[0xf] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0xe] - (0xff < sVar26);
    auVar65 = auVar49 & auVar38;
    auVar85 = auVar47 & auVar38;
    sVar26 = auVar65._0_2_;
    cVar18 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0] - (0xff < sVar26);
    sVar26 = auVar65._2_2_;
    sVar66 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * auVar65[2] - (0xff < sVar26),cVar18);
    sVar26 = auVar65._4_2_;
    cVar19 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[4] - (0xff < sVar26);
    sVar26 = auVar65._6_2_;
    uVar79 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * auVar65[6] - (0xff < sVar26),
                      CONCAT12(cVar19,sVar66));
    sVar26 = auVar65._8_2_;
    cVar20 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[8] - (0xff < sVar26);
    sVar26 = auVar65._10_2_;
    uVar80 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar65[10] - (0xff < sVar26),
                      CONCAT14(cVar20,uVar79));
    sVar26 = auVar65._12_2_;
    cVar21 = (0 < sVar26) * (sVar26 < 0x100) * auVar65[0xc] - (0xff < sVar26);
    sVar26 = auVar65._14_2_;
    uVar81 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * auVar65[0xe] - (0xff < sVar26),
                      CONCAT16(cVar21,uVar80));
    sVar26 = auVar85._0_2_;
    cVar22 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0] - (0xff < sVar26);
    sVar26 = auVar85._2_2_;
    auVar82._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * auVar85[2] - (0xff < sVar26),
                  CONCAT18(cVar22,uVar81));
    sVar26 = auVar85._4_2_;
    cVar23 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[4] - (0xff < sVar26);
    auVar82[10] = cVar23;
    sVar26 = auVar85._6_2_;
    auVar82[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[6] - (0xff < sVar26);
    sVar26 = auVar85._8_2_;
    cVar24 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[8] - (0xff < sVar26);
    auVar83[0xc] = cVar24;
    auVar83._0_12_ = auVar82;
    sVar26 = auVar85._10_2_;
    auVar83[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[10] - (0xff < sVar26);
    sVar26 = auVar85._12_2_;
    cVar25 = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0xc] - (0xff < sVar26);
    auVar86[0xe] = cVar25;
    auVar86._0_14_ = auVar83;
    sVar26 = auVar85._14_2_;
    auVar86[0xf] = (0 < sVar26) * (sVar26 < 0x100) * auVar85[0xe] - (0xff < sVar26);
    cVar16 = (0 < sVar56) * (sVar56 < 0x100) * cVar16 - (0xff < sVar56);
    sVar26 = (short)((uint)uVar68 >> 0x10);
    sVar67 = CONCAT11((0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26),cVar16);
    sVar26 = (short)((uint6)uVar69 >> 0x20);
    cVar12 = (0 < sVar26) * (sVar26 < 0x100) * cVar12 - (0xff < sVar26);
    sVar26 = (short)((ulong)uVar70 >> 0x30);
    uVar68 = CONCAT13((0 < sVar26) * (sVar26 < 0x100) * cVar13 - (0xff < sVar26),
                      CONCAT12(cVar12,sVar67));
    sVar26 = (short)((unkuint10)auVar72._0_10_ >> 0x40);
    cVar13 = (0 < sVar26) * (sVar26 < 0x100) * cVar10 - (0xff < sVar26);
    sVar26 = auVar72._10_2_;
    uVar69 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * cVar14 - (0xff < sVar26),
                      CONCAT14(cVar13,uVar68));
    sVar26 = auVar75._12_2_;
    cVar15 = (0 < sVar26) * (sVar26 < 0x100) * cVar15 - (0xff < sVar26);
    sVar26 = auVar84._14_2_;
    uVar70 = CONCAT17((0 < sVar26) * (sVar26 < 0x100) * cVar17 - (0xff < sVar26),
                      CONCAT16(cVar15,uVar69));
    cVar17 = (0 < sVar66) * (sVar66 < 0x100) * cVar18 - (0xff < sVar66);
    sVar26 = (short)((uint)uVar79 >> 0x10);
    auVar73._0_10_ =
         CONCAT19((0 < sVar26) * (sVar26 < 0x100) * cVar19 - (0xff < sVar26),CONCAT18(cVar17,uVar70)
                 );
    sVar26 = (short)((uint6)uVar80 >> 0x20);
    cVar14 = (0 < sVar26) * (sVar26 < 0x100) * cVar20 - (0xff < sVar26);
    auVar73[10] = cVar14;
    sVar26 = (short)((ulong)uVar81 >> 0x30);
    auVar73[0xb] = (0 < sVar26) * (sVar26 < 0x100) * cVar21 - (0xff < sVar26);
    sVar26 = (short)((unkuint10)auVar82._0_10_ >> 0x40);
    cVar11 = (0 < sVar26) * (sVar26 < 0x100) * cVar22 - (0xff < sVar26);
    auVar76[0xc] = cVar11;
    auVar76._0_12_ = auVar73;
    sVar26 = auVar82._10_2_;
    auVar76[0xd] = (0 < sVar26) * (sVar26 < 0x100) * cVar23 - (0xff < sVar26);
    sVar26 = auVar83._12_2_;
    cVar10 = (0 < sVar26) * (sVar26 < 0x100) * cVar24 - (0xff < sVar26);
    auVar78[0xe] = cVar10;
    auVar78._0_14_ = auVar76;
    sVar26 = auVar86._14_2_;
    auVar78[0xf] = (0 < sVar26) * (sVar26 < 0x100) * cVar25 - (0xff < sVar26);
    sVar26 = (short)((uint)uVar58 >> 0x10);
    sVar56 = (short)((uint6)uVar59 >> 0x20);
    sVar66 = (short)((ulong)uVar60 >> 0x30);
    sVar27 = (short)((unkuint10)auVar62._0_10_ >> 0x40);
    sVar28 = auVar62._10_2_;
    sVar29 = auVar64._12_2_;
    sVar30 = auVar77._14_2_;
    sVar31 = (short)((uint)uVar68 >> 0x10);
    sVar32 = (short)((uint6)uVar69 >> 0x20);
    sVar33 = (short)((ulong)uVar70 >> 0x30);
    sVar34 = (short)((unkuint10)auVar73._0_10_ >> 0x40);
    sVar35 = auVar73._10_2_;
    sVar36 = auVar76._12_2_;
    sVar37 = auVar78._14_2_;
    pcVar1 = (char *)((long)arg + lVar40);
    *pcVar1 = ((0 < sVar57) * (sVar57 < 0x100) * cVar2 - (0xff < sVar57)) + '\x01';
    pcVar1[1] = ((0 < sVar26) * (sVar26 < 0x100) * cVar3 - (0xff < sVar26)) + '\x01';
    pcVar1[2] = ((0 < sVar56) * (sVar56 < 0x100) * cVar4 - (0xff < sVar56)) + '\x01';
    pcVar1[3] = ((0 < sVar66) * (sVar66 < 0x100) * cVar5 - (0xff < sVar66)) + '\x01';
    pcVar1[4] = ((0 < sVar27) * (sVar27 < 0x100) * cVar6 - (0xff < sVar27)) + '\x01';
    pcVar1[5] = ((0 < sVar28) * (sVar28 < 0x100) * cVar7 - (0xff < sVar28)) + '\x01';
    pcVar1[6] = ((0 < sVar29) * (sVar29 < 0x100) * cVar8 - (0xff < sVar29)) + '\x01';
    pcVar1[7] = ((0 < sVar30) * (sVar30 < 0x100) * cVar9 - (0xff < sVar30)) + '\x01';
    pcVar1[8] = ((0 < sVar67) * (sVar67 < 0x100) * cVar16 - (0xff < sVar67)) + '\x01';
    pcVar1[9] = ((0 < sVar31) * (sVar31 < 0x100) * cVar12 - (0xff < sVar31)) + '\x01';
    pcVar1[10] = ((0 < sVar32) * (sVar32 < 0x100) * cVar13 - (0xff < sVar32)) + '\x01';
    pcVar1[0xb] = ((0 < sVar33) * (sVar33 < 0x100) * cVar15 - (0xff < sVar33)) + '\x01';
    pcVar1[0xc] = ((0 < sVar34) * (sVar34 < 0x100) * cVar17 - (0xff < sVar34)) + '\x01';
    pcVar1[0xd] = ((0 < sVar35) * (sVar35 < 0x100) * cVar14 - (0xff < sVar35)) + '\x01';
    pcVar1[0xe] = ((0 < sVar36) * (sVar36 < 0x100) * cVar11 - (0xff < sVar36)) + '\x01';
    pcVar1[0xf] = ((0 < sVar37) * (sVar37 < 0x100) * cVar10 - (0xff < sVar37)) + '\x01';
    lVar48 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + 0x10;
    auVar55._8_8_ = lVar48 + 0x10;
    lVar48 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + 0x10;
    auVar54._8_8_ = lVar48 + 0x10;
    lVar48 = auVar53._8_8_;
    auVar53._0_8_ = auVar53._0_8_ + 0x10;
    auVar53._8_8_ = lVar48 + 0x10;
    lVar48 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + 0x10;
    auVar52._8_8_ = lVar48 + 0x10;
    lVar48 = auVar51._8_8_;
    auVar51._0_8_ = auVar51._0_8_ + 0x10;
    auVar51._8_8_ = lVar48 + 0x10;
    lVar48 = auVar50._8_8_;
    auVar50._0_8_ = auVar50._0_8_ + 0x10;
    auVar50._8_8_ = lVar48 + 0x10;
    lVar48 = auVar49._8_8_;
    auVar49._0_8_ = auVar49._0_8_ + 0x10;
    auVar49._8_8_ = lVar48 + 0x10;
    lVar48 = auVar47._8_8_;
    auVar47._0_8_ = auVar47._0_8_ + 0x10;
    auVar47._8_8_ = lVar48 + 0x10;
    lVar40 = lVar40 + 0x10;
  } while (lVar40 != 0x68);
  puVar44 = *arg;
  lVar40 = (long)arg + 8;
  iVar39 = secp256k1_ec_pubkey_parse(puVar44,lVar40,&local_28,0x21);
  uVar41 = (uint)lVar40;
  if (iVar39 == 1) {
    return;
  }
  bench_ecdh_setup_cold_1();
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  if (0 < (int)uVar41) {
    uVar46 = 0;
    do {
      uStack_b0 = CONCAT62(uStack_b0._2_6_,(short)uVar46);
      puVar45 = (undefined8 *)*puVar44;
      pcStack_b8 = (code *)0x104311;
      puVar43 = auStack_90;
      iVar39 = secp256k1_schnorrsig_sign_custom
                         (puVar45,auStack_90,&uStack_b0,0x20,
                          *(undefined8 *)(puVar44[2] + uVar46 * 8),0);
      uVar42 = (uint)puVar43;
      if (iVar39 == 0) {
        pcStack_b8 = bench_schnorrsig_verify;
        bench_schnorrsig_sign_cold_1();
        if ((int)uVar42 < 1) {
          return;
        }
        uVar46 = 0;
        puStack_d0 = puVar44;
        uStack_c8 = (ulong)uVar41;
        puStack_c0 = auStack_90;
        pcStack_b8 = (code *)&uStack_b0;
        goto LAB_0010434d;
      }
      uVar46 = uVar46 + 1;
    } while (uVar41 != uVar46);
  }
  return;
LAB_0010434d:
  iVar39 = secp256k1_xonly_pubkey_parse
                     (*puVar45,auStack_110,*(undefined8 *)(puVar45[3] + uVar46 * 8));
  if (iVar39 != 1) {
    bench_schnorrsig_verify_cold_1();
LAB_001043a2:
    bench_schnorrsig_verify_cold_2();
    halt_baddata();
  }
  iVar39 = secp256k1_schnorrsig_verify
                     (*puVar45,*(undefined8 *)(puVar45[4] + uVar46 * 8),
                      *(undefined8 *)(puVar45[5] + uVar46 * 8),0x20,auStack_110);
  if (iVar39 == 0) goto LAB_001043a2;
  uVar46 = uVar46 + 1;
  if (uVar42 == uVar46) {
    return;
  }
  goto LAB_0010434d;
}

Assistant:

static void bench_ecdh_setup(void* arg) {
    int i;
    bench_ecdh_data *data = (bench_ecdh_data*)arg;
    const unsigned char point[] = {
        0x03,
        0x54, 0x94, 0xc1, 0x5d, 0x32, 0x09, 0x97, 0x06,
        0xc2, 0x39, 0x5f, 0x94, 0x34, 0x87, 0x45, 0xfd,
        0x75, 0x7c, 0xe3, 0x0e, 0x4e, 0x8c, 0x90, 0xfb,
        0xa2, 0xba, 0xd1, 0x84, 0xf8, 0x83, 0xc6, 0x9f
    };

    for (i = 0; i < 32; i++) {
        data->scalar[i] = i + 1;
    }
    CHECK(secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1);
}